

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O2

int mapOceanMixMod(Layer *l,int *out,int x,int z,int w,int h)

{
  int id;
  int iVar1;
  void *__dest;
  long lVar2;
  ulong uVar3;
  void *pvVar4;
  size_t __size;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  (*l->p2->getMap)(l->p2,out,x,z,w,h);
  __size = (long)(h * w) << 2;
  __dest = malloc(__size);
  memcpy(__dest,out,__size);
  (*l->p->getMap)(l->p,out,x,z,w,h);
  lVar2 = (long)w;
  uVar5 = 0;
  lVar6 = 0;
  if (0 < lVar2) {
    lVar6 = lVar2;
  }
  uVar3 = (ulong)(uint)h;
  if (h < 1) {
    uVar3 = uVar5;
  }
  pvVar4 = __dest;
  for (; uVar5 != uVar3; uVar5 = uVar5 + 1) {
    for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
      id = out[lVar7];
      iVar1 = isOceanic(id);
      if (iVar1 != 0) {
        iVar1 = *(int *)((long)pvVar4 + lVar7 * 4);
        if (id == 0x18) {
          if (iVar1 == 0) {
            iVar1 = 0x18;
          }
          else if (iVar1 == 10) {
            iVar1 = 0x32;
          }
          else if (iVar1 == 0x2e) {
            iVar1 = 0x31;
          }
          else if (iVar1 == 0x2d) {
            iVar1 = 0x30;
          }
        }
        out[lVar7] = iVar1;
      }
    }
    pvVar4 = (void *)((long)pvVar4 + lVar2 * 4);
    out = out + lVar2;
  }
  free(__dest);
  return 0;
}

Assistant:

int mapOceanMixMod(const Layer * l, int * out, int x, int z, int w, int h)
{
    int *otyp;
    int64_t i, j;
    l->p2->getMap(l->p2, out, x, z, w, h);

    otyp = (int *) malloc(w*h*sizeof(int));
    memcpy(otyp, out, w*h*sizeof(int));

    l->p->getMap(l->p, out, x, z, w, h);


    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int landID, oceanID;

            landID = out[j*w + i];

            if (!isOceanic(landID))
                continue;

            oceanID = otyp[j*w + i];

            if (landID == deep_ocean)
            {
                switch (oceanID)
                {
                case lukewarm_ocean:
                    oceanID = deep_lukewarm_ocean;
                    break;
                case ocean:
                    oceanID = deep_ocean;
                    break;
                case cold_ocean:
                    oceanID = deep_cold_ocean;
                    break;
                case frozen_ocean:
                    oceanID = deep_frozen_ocean;
                    break;
                }
            }

            out[j*w + i] = oceanID;
        }
    }

    free(otyp);

    return 0;
}